

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ricecomp.c
# Opt level: O0

int fits_rcomp_byte(char *a,int nx,uchar *c,int clen,int nblock)

{
  char cVar1;
  uint uVar2;
  char cVar3;
  int iVar4;
  void *__ptr;
  byte bVar5;
  int in_ECX;
  Buffer_t *in_RDX;
  int in_ESI;
  char *in_RDI;
  int in_R8D;
  uint *diff;
  double dpsum;
  double pixelsum;
  uchar psum;
  int lbits_to_go;
  int lbitbuffer;
  int bbits;
  int fsbits;
  int fsmax;
  int top;
  int fsmask;
  int fs;
  int v;
  char pdiff;
  int nextpix;
  int lastpix;
  int thisblock;
  int j;
  int i;
  Buffer *buffer;
  Buffer bufmem;
  uint local_ac;
  double local_a0;
  double local_98;
  byte local_8d;
  int local_8c;
  uint local_88;
  int local_78;
  int local_70;
  int local_5c;
  int local_58;
  int local_54;
  Buffer local_48;
  int local_28;
  int local_14;
  char *local_10;
  int local_4;
  
  local_48.end = in_RDX + in_ECX;
  local_48.bits_to_go = 8;
  local_28 = in_R8D;
  local_14 = in_ESI;
  local_10 = in_RDI;
  local_48.start = in_RDX;
  local_48.current = in_RDX;
  __ptr = malloc((long)in_R8D << 2);
  if (__ptr == (void *)0x0) {
    ffpmsg((char *)0x256e2a);
    local_4 = -1;
  }
  else {
    start_outputing_bits(&local_48);
    iVar4 = output_nbits(&local_48,(int)*local_10,8);
    if (iVar4 == -1) {
      ffpmsg((char *)0x256e6f);
      free(__ptr);
      local_4 = -1;
    }
    else {
      cVar3 = *local_10;
      local_5c = local_28;
      for (local_54 = 0; local_54 < local_14; local_54 = local_28 + local_54) {
        if (local_14 - local_54 < local_28) {
          local_5c = local_14 - local_54;
        }
        local_98 = 0.0;
        for (local_58 = 0; local_58 < local_5c; local_58 = local_58 + 1) {
          cVar1 = local_10[local_54 + local_58];
          cVar3 = cVar1 - cVar3;
          if (cVar3 < '\0') {
            local_ac = (int)cVar3 << 1 ^ 0xffffffff;
          }
          else {
            local_ac = (int)cVar3 << 1;
          }
          *(uint *)((long)__ptr + (long)local_58 * 4) = local_ac;
          local_98 = (double)*(uint *)((long)__ptr + (long)local_58 * 4) + local_98;
          cVar3 = cVar1;
        }
        local_a0 = ((local_98 - (double)(local_5c / 2)) - 1.0) / (double)local_5c;
        if (local_a0 < 0.0) {
          local_a0 = 0.0;
        }
        local_70 = 0;
        for (local_8d = (byte)((int)((int)local_a0 & 0xffU) >> 1); local_8d != 0;
            local_8d = (byte)((int)(uint)local_8d >> 1)) {
          local_70 = local_70 + 1;
        }
        if (local_70 < 6) {
          if (((local_70 != 0) || (local_98 != 0.0)) || (NAN(local_98))) {
            iVar4 = output_nbits(&local_48,local_70 + 1,3);
            if (iVar4 == -1) {
              ffpmsg((char *)0x25714c);
              free(__ptr);
              return -1;
            }
            bVar5 = (byte)local_70;
            local_88 = local_48.bitbuffer;
            local_8c = local_48.bits_to_go;
            for (local_58 = 0; local_58 < local_5c; local_58 = local_58 + 1) {
              uVar2 = *(uint *)((long)__ptr + (long)local_58 * 4);
              local_78 = (int)uVar2 >> (bVar5 & 0x1f);
              if (local_8c < local_78 + 1) {
                *local_48.current = (Buffer_t)(local_88 << ((byte)local_8c & 0x1f));
                for (local_78 = local_78 - local_8c; local_48.current = local_48.current + 1,
                    7 < local_78; local_78 = local_78 + -8) {
                  *local_48.current = '\0';
                }
                local_88 = 1;
                local_8c = 7 - local_78;
              }
              else {
                local_88 = local_88 << ((char)local_78 + 1U & 0x1f) | 1;
                local_8c = local_8c - (local_78 + 1);
              }
              if (0 < local_70) {
                local_88 = uVar2 & (1 << (bVar5 & 0x1f)) - 1U | local_88 << (bVar5 & 0x1f);
                for (local_8c = local_8c - local_70; local_8c < 1; local_8c = local_8c + 8) {
                  *local_48.current = (Buffer_t)((int)local_88 >> (-(char)local_8c & 0x1fU));
                  local_48.current = local_48.current + 1;
                }
              }
            }
            if (local_48.end < local_48.current) {
              ffpmsg((char *)0x257323);
              free(__ptr);
              return -1;
            }
            local_48.bitbuffer = local_88;
            local_48.bits_to_go = local_8c;
          }
          else {
            iVar4 = output_nbits(&local_48,0,3);
            if (iVar4 == -1) {
              ffpmsg((char *)0x257107);
              free(__ptr);
              return -1;
            }
          }
        }
        else {
          iVar4 = output_nbits(&local_48,7,3);
          if (iVar4 == -1) {
            ffpmsg((char *)0x257048);
            free(__ptr);
            return -1;
          }
          for (local_58 = 0; local_58 < local_5c; local_58 = local_58 + 1) {
            iVar4 = output_nbits(&local_48,*(int *)((long)__ptr + (long)local_58 * 4),8);
            if (iVar4 == -1) {
              ffpmsg((char *)0x2570a0);
              free(__ptr);
              return -1;
            }
          }
        }
      }
      done_outputing_bits(&local_48);
      free(__ptr);
      local_4 = (int)local_48.current - (int)local_48.start;
    }
  }
  return local_4;
}

Assistant:

int fits_rcomp_byte(
	  signed char a[],		/* input array			*/
	  int nx,		/* number of input pixels	*/
	  unsigned char *c,	/* output buffer		*/
	  int clen,		/* max length of output		*/
	  int nblock)		/* coding block size		*/
{
Buffer bufmem, *buffer = &bufmem;
/* int bsize; */
int i, j, thisblock;

/* 
NOTE: in principle, the following 2 variable could be declared as 'short'
but in fact the code runs faster (on 32-bit Linux at least) as 'int'
*/
int lastpix, nextpix;
/* int pdiff; */
signed char pdiff; 
int v, fs, fsmask, top, fsmax, fsbits, bbits;
int lbitbuffer, lbits_to_go;
/* unsigned int psum; */
unsigned char psum;
double pixelsum, dpsum;
unsigned int *diff;

    /*
     * Original size of each pixel (bsize, bytes) and coding block
     * size (nblock, pixels)
     * Could make bsize a parameter to allow more efficient
     * compression of short & byte images.
     */
/*    bsize = 1;  */

/*    nblock = 32; now an input parameter */
    /*
     * From bsize derive:
     * FSBITS = # bits required to store FS
     * FSMAX = maximum value for FS
     * BBITS = bits/pixel for direct coding
     */

/*
    switch (bsize) {
    case 1:
	fsbits = 3;
	fsmax = 6;
	break;
    case 2:
	fsbits = 4;
	fsmax = 14;
	break;
    case 4:
	fsbits = 5;
	fsmax = 25;
	break;
    default:
        ffpmsg("rdecomp: bsize must be 1, 2, or 4 bytes");
	return(-1);
    }
*/

    /* move these out of switch block to further tweak performance */
    fsbits = 3;
    fsmax = 6;
    bbits = 1<<fsbits;

    /*
     * Set up buffer pointers
     */
    buffer->start = c;
    buffer->current = c;
    buffer->end = c+clen;
    buffer->bits_to_go = 8;
    /*
     * array for differences mapped to non-negative values
     */
    diff = (unsigned int *) malloc(nblock*sizeof(unsigned int));
    if (diff == (unsigned int *) NULL) {
        ffpmsg("fits_rcomp: insufficient memory");
	return(-1);
    }
    /*
     * Code in blocks of nblock pixels
     */
    start_outputing_bits(buffer);

    /* write out first byte value to the first  byte of the buffer */
    if (output_nbits(buffer, a[0], 8) == EOF) {
        ffpmsg("rice_encode: end of buffer");
        free(diff);
        return(-1);
    }

    lastpix = a[0];  /* the first difference will always be zero */

    thisblock = nblock;
    for (i=0; i<nx; i += nblock) {
	/* last block may be shorter */
	if (nx-i < nblock) thisblock = nx-i;
	/*
	 * Compute differences of adjacent pixels and map them to unsigned values.
	 * Note that this may overflow the integer variables -- that's
	 * OK, because we can recover when decompressing.  If we were
	 * compressing shorts or bytes, would want to do this arithmetic
	 * with short/byte working variables (though diff will still be
	 * passed as an int.)
	 *
	 * compute sum of mapped pixel values at same time
	 * use double precision for sum to allow 32-bit integer inputs
	 */
	pixelsum = 0.0;
	for (j=0; j<thisblock; j++) {
	    nextpix = a[i+j];
	    pdiff = nextpix - lastpix;
	    diff[j] = (unsigned int) ((pdiff<0) ? ~(pdiff<<1) : (pdiff<<1));
	    pixelsum += diff[j];
	    lastpix = nextpix;
	}
	/*
	 * compute number of bits to split from sum
	 */
	dpsum = (pixelsum - (thisblock/2) - 1)/thisblock;
	if (dpsum < 0) dpsum = 0.0;
/*	psum = ((unsigned int) dpsum ) >> 1; */
	psum = ((unsigned char) dpsum ) >> 1;
	for (fs = 0; psum>0; fs++) psum >>= 1;

	/*
	 * write the codes
	 * fsbits ID bits used to indicate split level
	 */
	if (fs >= fsmax) {
	    /* Special high entropy case when FS >= fsmax
	     * Just write pixel difference values directly, no Rice coding at all.
	     */
	    if (output_nbits(buffer, fsmax+1, fsbits) == EOF) {
                ffpmsg("rice_encode: end of buffer");
                free(diff);
		return(-1);
	    }
	    for (j=0; j<thisblock; j++) {
		if (output_nbits(buffer, diff[j], bbits) == EOF) {
                    ffpmsg("rice_encode: end of buffer");
                    free(diff);
		    return(-1);
		}
	    }
	} else if (fs == 0 && pixelsum == 0) {
	    /*
	     * special low entropy case when FS = 0 and pixelsum=0 (all
	     * pixels in block are zero.)
	     * Output a 0 and return
	     */
	    if (output_nbits(buffer, 0, fsbits) == EOF) {
                ffpmsg("rice_encode: end of buffer");
                free(diff);
		return(-1);
	    }
	} else {
	    /* normal case: not either very high or very low entropy */
	    if (output_nbits(buffer, fs+1, fsbits) == EOF) {
                ffpmsg("rice_encode: end of buffer");
                free(diff);
		return(-1);
	    }
	    fsmask = (1<<fs) - 1;
	    /*
	     * local copies of bit buffer to improve optimization
	     */
	    lbitbuffer = buffer->bitbuffer;
	    lbits_to_go = buffer->bits_to_go;
	    for (j=0; j<thisblock; j++) {
		v = diff[j];
		top = v >> fs;
		/*
		 * top is coded by top zeros + 1
		 */
		if (lbits_to_go >= top+1) {
		    lbitbuffer <<= top+1;
		    lbitbuffer |= 1;
		    lbits_to_go -= top+1;
		} else {
		    lbitbuffer <<= lbits_to_go;
		    putcbuf(lbitbuffer & 0xff,buffer);
		    for (top -= lbits_to_go; top>=8; top -= 8) {
			putcbuf(0, buffer);
		    }
		    lbitbuffer = 1;
		    lbits_to_go = 7-top;
		}
		/*
		 * bottom FS bits are written without coding
		 * code is output_nbits, moved into this routine to reduce overheads
		 * This code potentially breaks if FS>24, so I am limiting
		 * FS to 24 by choice of FSMAX above.
		 */
		if (fs > 0) {
		    lbitbuffer <<= fs;
		    lbitbuffer |= v & fsmask;
		    lbits_to_go -= fs;
		    while (lbits_to_go <= 0) {
			putcbuf((lbitbuffer>>(-lbits_to_go)) & 0xff,buffer);
			lbits_to_go += 8;
		    }
		}
	    }
	    /* check if overflowed output buffer */
	    if (buffer->current > buffer->end) {
                 ffpmsg("rice_encode: end of buffer");
                 free(diff);
		 return(-1);
	    }
	    buffer->bitbuffer = lbitbuffer;
	    buffer->bits_to_go = lbits_to_go;
	}
    }
    done_outputing_bits(buffer);
    free(diff);
    /*
     * return number of bytes used
     */
    return(buffer->current - buffer->start);
}